

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O2

int __thiscall gl4cts::GPUShaderFP64Tests::init(GPUShaderFP64Tests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  GPUShaderFP64Test1 *this_00;
  GPUShaderFP64Test2 *this_01;
  GPUShaderFP64Test3 *this_02;
  GPUShaderFP64Test4 *this_03;
  GPUShaderFP64Test5 *this_04;
  GPUShaderFP64Test6 *this_05;
  GPUShaderFP64Test7 *this_06;
  GPUShaderFP64Test8 *this_07;
  GPUShaderFP64Test9 *this_08;
  GPUShaderFP64Test10 *this_09;
  
  this_00 = (GPUShaderFP64Test1 *)operator_new(0x170);
  GPUShaderFP64Test1::GPUShaderFP64Test1(this_00,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
  this_01 = (GPUShaderFP64Test2 *)operator_new(200);
  GPUShaderFP64Test2::GPUShaderFP64Test2(this_01,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_01);
  this_02 = (GPUShaderFP64Test3 *)operator_new(0x1a8);
  GPUShaderFP64Test3::GPUShaderFP64Test3(this_02,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_02);
  this_03 = (GPUShaderFP64Test4 *)operator_new(0x14e8);
  GPUShaderFP64Test4::GPUShaderFP64Test4(this_03,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_03);
  this_04 = (GPUShaderFP64Test5 *)operator_new(0xf8);
  GPUShaderFP64Test5::GPUShaderFP64Test5(this_04,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_04);
  this_05 = (GPUShaderFP64Test6 *)operator_new(0x98);
  GPUShaderFP64Test6::GPUShaderFP64Test6(this_05,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_05);
  this_06 = (GPUShaderFP64Test7 *)operator_new(0x170);
  GPUShaderFP64Test7::GPUShaderFP64Test7(this_06,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_06);
  this_07 = (GPUShaderFP64Test8 *)operator_new(0x98);
  GPUShaderFP64Test8::GPUShaderFP64Test8(this_07,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_07);
  this_08 = (GPUShaderFP64Test9 *)operator_new(0x90);
  GPUShaderFP64Test9::GPUShaderFP64Test9(this_08,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_08);
  this_09 = (GPUShaderFP64Test10 *)operator_new(0x100);
  GPUShaderFP64Test10::GPUShaderFP64Test10(this_09,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_09);
  return extraout_EAX;
}

Assistant:

void GPUShaderFP64Tests::init(void)
{
	addChild(new GPUShaderFP64Test1(m_context));
	addChild(new GPUShaderFP64Test2(m_context));
	addChild(new GPUShaderFP64Test3(m_context));
	addChild(new GPUShaderFP64Test4(m_context));
	addChild(new GPUShaderFP64Test5(m_context));
	addChild(new GPUShaderFP64Test6(m_context));
	addChild(new GPUShaderFP64Test7(m_context));
	addChild(new GPUShaderFP64Test8(m_context));
	addChild(new GPUShaderFP64Test9(m_context));
	addChild(new GPUShaderFP64Test10(m_context));
}